

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_font_atlas_init_custom(nk_font_atlas *atlas,nk_allocator *permanent,nk_allocator *temporary)

{
  nk_plugin_alloc p_Var1;
  ulong uVar2;
  ulong uVar3;
  nk_font_atlas *__s;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3443,
                  "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
                 );
  }
  if (permanent != (nk_allocator *)0x0) {
    if (temporary != (nk_allocator *)0x0) {
      uVar2 = (ulong)atlas & 3;
      if (uVar2 == 0) {
        uVar3 = 400;
        __s = atlas;
      }
      else {
        memset(atlas,0,4 - uVar2);
        uVar3 = uVar2 | 0x18c;
        __s = (nk_font_atlas *)((4 - uVar2) + (long)atlas);
      }
      uVar2 = (ulong)((uint)uVar3 & 0xfffffffc);
      memset(__s,0,uVar2);
      if ((uVar3 & 3) != 0) {
        memset((void *)((long)(&__s->cursors[0].img + -3) + uVar2),0,uVar3 & 3);
      }
      (atlas->permanent).free = permanent->free;
      p_Var1 = permanent->alloc;
      (atlas->permanent).userdata = permanent->userdata;
      (atlas->permanent).alloc = p_Var1;
      p_Var1 = temporary->alloc;
      (atlas->temporary).userdata = temporary->userdata;
      (atlas->temporary).alloc = p_Var1;
      (atlas->temporary).free = temporary->free;
      return;
    }
    __assert_fail("temporary",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3445,
                  "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
                 );
  }
  __assert_fail("permanent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x3444,
                "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
               );
}

Assistant:

NK_API void
nk_font_atlas_init_custom(struct nk_font_atlas *atlas,
    struct nk_allocator *permanent, struct nk_allocator *temporary)
{
    NK_ASSERT(atlas);
    NK_ASSERT(permanent);
    NK_ASSERT(temporary);
    if (!atlas || !permanent || !temporary) return;
    nk_zero_struct(*atlas);
    atlas->permanent = *permanent;
    atlas->temporary = *temporary;
}